

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

void Abc_NtkSupportSum(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  long lVar3;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_30;
  
  pVVar1 = pNtk->vCos;
  if (pVVar1->nSize < 1) {
    uVar2 = 0;
  }
  else {
    lVar3 = 0;
    uVar2 = 0;
    do {
      local_30 = (Abc_Obj_t *)pVVar1->pArray[lVar3];
      pVVar1 = Abc_NtkNodeSupport(pNtk,&local_30,1);
      uVar2 = uVar2 + pVVar1->nSize;
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
      }
      free(pVVar1);
      lVar3 = lVar3 + 1;
      pVVar1 = pNtk->vCos;
    } while (lVar3 < pVVar1->nSize);
  }
  printf("Total supports = %d.\n",(ulong)uVar2);
  return;
}

Assistant:

void Abc_NtkSupportSum( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    int i, nTotalSupps = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        nTotalSupps += Vec_PtrSize( vSupp );
        Vec_PtrFree( vSupp );
    }
    printf( "Total supports = %d.\n", nTotalSupps );
}